

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::FCDUTF8CollationIterator::handleNextCE32
          (FCDUTF8CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  int32_t *pi;
  byte bVar1;
  short sVar2;
  int iVar3;
  uint8_t *s;
  UTrie2 *pUVar4;
  UBool UVar5;
  State SVar6;
  uint uVar7;
  uint32_t uVar8;
  char16_t *pcVar9;
  uint32_t *puVar10;
  uint uVar11;
  UErrorCode *pUVar12;
  UErrorCode *extraout_RDX;
  uint uVar13;
  int32_t iVar14;
  int iVar15;
  
  pi = &(this->super_UTF8CollationIterator).pos;
  pUVar12 = errorCode;
LAB_0024df0d:
  switch(this->state) {
  case CHECK_FWD:
    iVar15 = (this->super_UTF8CollationIterator).pos;
    if (iVar15 == (this->super_UTF8CollationIterator).length) goto LAB_0024e20e;
    s = (this->super_UTF8CollationIterator).u8;
    (this->super_UTF8CollationIterator).pos = iVar15 + 1;
    bVar1 = s[iVar15];
    uVar11 = (uint)bVar1;
    *c = uVar11;
    if (-1 < (char)bVar1) {
      puVar10 = ((this->super_UTF8CollationIterator).super_CollationIterator.trie)->data32;
      goto LAB_0024e2ac;
    }
    uVar11 = (uint)bVar1;
    iVar15 = (this->super_UTF8CollationIterator).length;
    if ((bVar1 & 0xf0) == 0xe0) {
      iVar3 = *pi;
      if (iVar3 + 1 < iVar15 || iVar15 < 0) {
        if ((((byte)" 000000000000\x1000"[uVar11 & 0xf] >> (s[iVar3] >> 5) & 1) != 0) &&
           ((byte)(s[(long)iVar3 + 1] ^ 0x80) < 0x40)) {
          *c = (s[iVar3] & 0x3f) << 6 | (uVar11 & 0xf) << 0xc | s[(long)iVar3 + 1] ^ 0x80;
          iVar15 = *pi;
          *pi = iVar15 + 2;
          uVar13 = *c;
          if ((((int)uVar13 < 0xc0) ||
              (((ulong)(byte)CollationFCD::tcccIndex[uVar13 >> 5] == 0 ||
               ((*(uint *)(CollationFCD::tcccBits +
                          (ulong)(byte)CollationFCD::tcccIndex[uVar13 >> 5] * 4) >> (uVar13 & 0x1f)
                & 1) == 0)))) ||
             (((uVar13 & 0x1fff01) != 0xf01 &&
              ((iVar15 + 2 == (this->super_UTF8CollationIterator).length ||
               (UVar5 = nextHasLccc(this), UVar5 == '\0')))))) goto LAB_0024e28e;
          goto LAB_0024e17a;
        }
      }
LAB_0024e17f:
      uVar11 = utf8_nextCharSafeBody_63(s,pi,iVar15,uVar11,-3);
      *c = uVar11;
      if (uVar11 == 0xfffd) {
        return 0xfffd0505;
      }
      uVar7 = (uVar11 >> 10) + 0xd7c0 & 0xffff;
      if ((((uVar7 < 0xc0) || ((ulong)(byte)CollationFCD::tcccIndex[uVar7 >> 5] == 0)) ||
          ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar7 >> 5] * 4)
            >> (uVar11 >> 10 & 0x1f) & 1) == 0)) ||
         ((iVar15 = (this->super_UTF8CollationIterator).pos,
          iVar15 == (this->super_UTF8CollationIterator).length ||
          (UVar5 = nextHasLccc(this), UVar5 == '\0')))) {
        uVar8 = CollationData::getCE32FromSupplementary
                          ((this->super_UTF8CollationIterator).super_CollationIterator.data,uVar11);
        return uVar8;
      }
      iVar14 = iVar15 + -4;
    }
    else {
      if (((0x1d < (byte)(bVar1 + 0x3e)) || (*pi == iVar15)) ||
         (uVar7 = s[*pi] ^ 0x80, 0x3f < (byte)uVar7)) goto LAB_0024e17f;
      pUVar4 = (this->super_UTF8CollationIterator).super_CollationIterator.trie;
      uVar8 = pUVar4->data32[pUVar4->index[(ulong)bVar1 + 0x760] + uVar7];
      *c = (uVar11 & 0x1f) << 6 | uVar7;
      iVar15 = (this->super_UTF8CollationIterator).pos;
      (this->super_UTF8CollationIterator).pos = iVar15 + 1;
      uVar11 = *c;
      if ((int)uVar11 < 0xc0) {
        return uVar8;
      }
      if ((ulong)(byte)CollationFCD::tcccIndex[uVar11 >> 5] == 0) {
        return uVar8;
      }
      if ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar11 >> 5] * 4)
           >> (uVar11 & 0x1f) & 1) == 0) {
        return uVar8;
      }
      if (iVar15 + 1 == (this->super_UTF8CollationIterator).length) {
        return uVar8;
      }
      UVar5 = nextHasLccc(this);
      if (UVar5 == '\0') {
        return uVar8;
      }
LAB_0024e17a:
      iVar14 = iVar15 + -1;
    }
    (this->super_UTF8CollationIterator).pos = iVar14;
    UVar5 = nextSegment(this,errorCode);
    pUVar12 = extraout_RDX;
    if (UVar5 == '\0') {
LAB_0024e20e:
      *c = -1;
      return 0xc0;
    }
    goto LAB_0024df0d;
  case CHECK_BWD:
    iVar15 = (this->super_UTF8CollationIterator).pos;
    this->start = iVar15;
    SVar6 = (uint)(iVar15 != this->limit) * 2;
    break;
  case IN_FCD_SEGMENT:
    SVar6 = CHECK_FWD;
    if ((this->super_UTF8CollationIterator).pos != this->limit) {
      uVar8 = UTF8CollationIterator::handleNextCE32(&this->super_UTF8CollationIterator,c,pUVar12);
      return uVar8;
    }
    break;
  case IN_NORMALIZED:
    sVar2 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar11 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      uVar11 = (int)sVar2 >> 5;
    }
    pUVar12 = (UErrorCode *)(ulong)uVar11;
    uVar7 = (this->super_UTF8CollationIterator).pos;
    if (uVar7 != uVar11) {
      *pi = uVar7 + 1;
      uVar13 = 0xffff;
      if (uVar7 < uVar11) {
        if (((int)sVar2 & 2U) == 0) {
          pcVar9 = (this->normalized).fUnion.fFields.fArray;
        }
        else {
          pcVar9 = (char16_t *)((long)&(this->normalized).fUnion + 2);
        }
        uVar13 = (uint)(ushort)pcVar9[(int)uVar7];
      }
      *c = uVar13;
LAB_0024e28e:
      pUVar4 = (this->super_UTF8CollationIterator).super_CollationIterator.trie;
      puVar10 = pUVar4->data32;
      uVar11 = (uVar13 & 0x1f) + (uint)pUVar4->index[(int)uVar13 >> 5] * 4;
LAB_0024e2ac:
      return puVar10[uVar11];
    }
  default:
    iVar14 = this->limit;
    (this->super_UTF8CollationIterator).pos = iVar14;
    this->start = iVar14;
    SVar6 = CHECK_FWD;
  }
  this->state = SVar6;
  goto LAB_0024df0d;
}

Assistant:

uint32_t
FCDUTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == CHECK_FWD) {
            // Combination of UTF8CollationIterator::handleNextCE32() with FCD check fastpath.
            if(pos == length) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = u8[pos++];
            if(U8_IS_SINGLE(c)) {
                // ASCII 00..7F
                return trie->data32[c];
            }
            uint8_t t1, t2;
            if(0xe0 <= c && c < 0xf0 &&
                    ((pos + 1) < length || length < 0) &&
                    U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
                    (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
                // U+0800..U+FFFF except surrogates
                c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
                pos += 2;
                if(CollationFCD::hasTccc(c) &&
                        (CollationFCD::maybeTibetanCompositeVowel(c) ||
                            (pos != length && nextHasLccc()))) {
                    pos -= 3;
                } else {
                    break;  // return CE32(BMP)
                }
            } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
                // U+0080..U+07FF
                uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
                c = ((c & 0x1f) << 6) | t1;
                ++pos;
                if(CollationFCD::hasTccc(c) && pos != length && nextHasLccc()) {
                    pos -= 2;
                } else {
                    return ce32;
                }
            } else {
                // Function call for supplementary code points and error cases.
                // Illegal byte sequences yield U+FFFD.
                c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
                if(c == 0xfffd) {
                    return Collation::FFFD_CE32;
                } else {
                    U_ASSERT(c > 0xffff);
                    if(CollationFCD::hasTccc(U16_LEAD(c)) && pos != length && nextHasLccc()) {
                        pos -= 4;
                    } else {
                        return data->getCE32FromSupplementary(c);
                    }
                }
            }
            if(!nextSegment(errorCode)) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            continue;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            return UTF8CollationIterator::handleNextCE32(c, errorCode);
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}